

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m256i *ptr;
  int32_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar16;
  __m256i *palVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int32_t segNum;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong size;
  int iVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  __m256i_32_t e;
  __m256i_32_t h;
  long local_120;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar1 = (profile->profile32).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_table_scan_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_avx2_256_32_cold_6();
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          parasail_nw_table_scan_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_avx2_256_32_cold_4();
        }
        else {
          uVar25 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_avx2_256_32_cold_1();
          }
          else {
            iVar29 = uVar19 - 1;
            size = (ulong)uVar19 + 7 >> 3;
            iVar28 = (int)size;
            iVar18 = -open;
            iVar12 = ppVar2->min;
            uVar21 = 0x80000000 - iVar12;
            if (iVar12 != iVar18 && SBORROW4(iVar12,iVar18) == iVar12 + open < 0) {
              uVar21 = open | 0x80000000;
            }
            iVar12 = 0x7ffffffe - ppVar2->max;
            ppVar15 = parasail_result_new_table1((uint)((ulong)uVar19 + 7) & 0x7ffffff8,s2Len);
            if (ppVar15 != (parasail_result_t *)0x0) {
              ppVar15->flag = ppVar15->flag | 0x8420401;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int32_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar13 = s2Len + -1;
                iVar14 = 7 - iVar29 / iVar28;
                auVar32._4_4_ = open;
                auVar32._0_4_ = open;
                auVar32._8_4_ = open;
                auVar32._12_4_ = open;
                auVar32._16_4_ = open;
                auVar32._20_4_ = open;
                auVar32._24_4_ = open;
                auVar32._28_4_ = open;
                auVar33._4_4_ = gap;
                auVar33._0_4_ = gap;
                auVar33._8_4_ = gap;
                auVar33._12_4_ = gap;
                auVar33._16_4_ = gap;
                auVar33._20_4_ = gap;
                auVar33._24_4_ = gap;
                auVar33._28_4_ = gap;
                iVar16 = uVar21 + 1;
                auVar30._4_4_ = iVar16;
                auVar30._0_4_ = iVar16;
                auVar30._8_4_ = iVar16;
                auVar30._12_4_ = iVar16;
                auVar30._16_4_ = iVar16;
                auVar30._20_4_ = iVar16;
                auVar30._24_4_ = iVar16;
                auVar30._28_4_ = iVar16;
                auVar31._4_4_ = iVar12;
                auVar31._0_4_ = iVar12;
                auVar31._8_4_ = iVar12;
                auVar31._12_4_ = iVar12;
                auVar31._16_4_ = iVar12;
                auVar31._20_4_ = iVar12;
                auVar31._24_4_ = iVar12;
                auVar31._28_4_ = iVar12;
                iVar12 = -(iVar28 * gap);
                auVar35._4_4_ = iVar12;
                auVar35._0_4_ = iVar12;
                auVar35._8_4_ = iVar12;
                auVar35._12_4_ = iVar12;
                auVar35._16_4_ = iVar12;
                auVar35._20_4_ = iVar12;
                auVar35._24_4_ = iVar12;
                auVar35._28_4_ = iVar12;
                auVar35 = vpblendd_avx2(auVar35,SUB6432(ZEXT1664((undefined1  [16])0x0),0),1);
                auVar34 = ZEXT1232(CONCAT84(SUB128(ZEXT812(0),4),iVar16));
                auVar35 = vpaddd_avx2(auVar34,auVar35);
                uVar20 = 0;
                iVar12 = iVar18;
                do {
                  lVar23 = 0;
                  iVar16 = iVar12;
                  do {
                    *(int *)((long)&local_80 + lVar23 * 4) = iVar16;
                    lVar24 = (long)iVar16 - (ulong)(uint)open;
                    if (lVar24 < -0x7fffffff) {
                      lVar24 = -0x80000000;
                    }
                    *(int *)((long)&local_a0 + lVar23 * 4) = (int)lVar24;
                    lVar23 = lVar23 + 1;
                    iVar16 = iVar16 - iVar28 * gap;
                  } while (lVar23 != 8);
                  palVar17 = ptr_02 + uVar20;
                  (*palVar17)[0] = local_80;
                  (*palVar17)[1] = lStack_78;
                  (*palVar17)[2] = lStack_70;
                  (*palVar17)[3] = lStack_68;
                  palVar17 = ptr + uVar20;
                  (*palVar17)[0] = local_a0;
                  (*palVar17)[1] = lStack_98;
                  (*palVar17)[2] = lStack_90;
                  (*palVar17)[3] = lStack_88;
                  uVar20 = uVar20 + 1;
                  iVar12 = iVar12 - gap;
                } while (uVar20 != size);
                *ptr_00 = 0;
                uVar20 = 1;
                do {
                  ptr_00[uVar20] = iVar18;
                  uVar20 = uVar20 + 1;
                  iVar18 = iVar18 - gap;
                } while (s2Len + 1 != uVar20);
                alVar7 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
                palVar17 = ptr_03 + (iVar28 - 1U);
                uVar20 = size;
                do {
                  *palVar17 = alVar7;
                  alVar7 = (__m256i)vpsubd_avx2((undefined1  [32])alVar7,auVar33);
                  palVar17 = palVar17 + -1;
                  iVar12 = (int)uVar20;
                  uVar19 = iVar12 - 1;
                  uVar20 = (ulong)uVar19;
                } while (uVar19 != 0 && 0 < iVar12);
                uVar20 = 1;
                if (1 < s2Len) {
                  uVar20 = uVar25;
                }
                lVar23 = (ulong)(iVar28 + (uint)(iVar28 == 0)) << 5;
                lVar24 = size * uVar25;
                local_120 = 0;
                auVar6 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                uVar22 = 0;
                auVar36 = ZEXT3264(auVar30);
                auVar37 = ZEXT3264(auVar31);
                do {
                  auVar11 = vpermd_avx2(auVar6,(undefined1  [32])ptr_02[iVar28 - 1U]);
                  auVar11 = vpblendd_avx2(auVar11,ZEXT432((uint)ptr_00[uVar22]),1);
                  iVar12 = ppVar2->mapper[(byte)s2[uVar22]];
                  auVar8 = vpsubd_avx2(auVar30,(undefined1  [32])*ptr_03);
                  lVar26 = 0;
                  auVar5 = auVar30;
                  do {
                    auVar4 = vpaddd_avx2(auVar11,*(undefined1 (*) [32])
                                                  ((long)pvVar1 +
                                                  lVar26 + (long)iVar12 * size * 0x20));
                    auVar11 = *(undefined1 (*) [32])((long)*ptr_02 + lVar26);
                    auVar9 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr + lVar26),auVar33);
                    auVar10 = vpsubd_avx2(auVar11,auVar32);
                    auVar9 = vpmaxsd_avx2(auVar9,auVar10);
                    auVar8 = vpaddd_avx2(auVar8,*(undefined1 (*) [32])((long)*ptr_03 + lVar26));
                    auVar5 = vpmaxsd_avx2(auVar5,auVar8);
                    auVar8 = vpmaxsd_avx2(auVar9,auVar4);
                    *(undefined1 (*) [32])((long)*ptr + lVar26) = auVar9;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar26) = auVar8;
                    lVar26 = lVar26 + 0x20;
                  } while (lVar23 != lVar26);
                  auVar11 = vpermd_avx2(auVar6,auVar8);
                  lVar26 = uVar22 + 1;
                  uVar22 = uVar22 + 1;
                  auVar8 = vpblendd_avx2(auVar11,ZEXT432((uint)ptr_00[lVar26]),1);
                  auVar11 = vpaddd_avx2(auVar8,(undefined1  [32])*ptr_03);
                  auVar11 = vpmaxsd_avx2(auVar5,auVar11);
                  iVar12 = 6;
                  do {
                    auVar5 = vperm2i128_avx2(auVar11,auVar11,0x28);
                    auVar5 = vpalignr_avx2(auVar11,auVar5,0xc);
                    auVar5 = vpaddd_avx2(auVar5,auVar35);
                    auVar11 = vpmaxsd_avx2(auVar11,auVar5);
                    iVar12 = iVar12 + -1;
                  } while (iVar12 != 0);
                  auVar5 = vperm2i128_avx2(auVar11,auVar11,0x28);
                  auVar11 = vpalignr_avx2(auVar11,auVar5,0xc);
                  auVar11 = vpaddd_avx2(auVar11,auVar34);
                  auVar5 = vpmaxsd_avx2(auVar8,auVar11);
                  lVar27 = 0;
                  lVar26 = local_120;
                  do {
                    auVar11 = vpsubd_avx2(auVar11,auVar33);
                    auVar5 = vpsubd_avx2(auVar5,auVar32);
                    auVar11 = vpmaxsd_avx2(auVar11,auVar5);
                    auVar5 = vpmaxsd_avx2(auVar11,*(undefined1 (*) [32])((long)*ptr_01 + lVar27));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar27) = auVar5;
                    piVar3 = ((ppVar15->field_4).rowcols)->score_row;
                    *(int *)((long)piVar3 + lVar26) = auVar5._0_4_;
                    *(int *)((long)piVar3 + lVar24 * 4 + lVar26) = auVar5._4_4_;
                    *(int *)((long)piVar3 + lVar24 * 8 + lVar26) = auVar5._8_4_;
                    *(int *)((long)piVar3 + lVar24 * 0xc + lVar26) = auVar5._12_4_;
                    *(int *)((long)piVar3 + lVar24 * 0x10 + lVar26) = auVar5._16_4_;
                    *(int *)((long)piVar3 + lVar24 * 0x14 + lVar26) = auVar5._20_4_;
                    *(int *)((long)piVar3 + lVar24 * 0x18 + lVar26) = auVar5._24_4_;
                    *(int *)((long)piVar3 + lVar24 * 0x1c + lVar26) = auVar5._28_4_;
                    auVar4 = vpminsd_avx2(auVar37._0_32_,auVar5);
                    auVar37 = ZEXT3264(auVar4);
                    auVar8 = vpmaxsd_avx2(auVar36._0_32_,auVar5);
                    auVar36 = ZEXT3264(auVar8);
                    lVar27 = lVar27 + 0x20;
                    lVar26 = lVar26 + uVar25 * 4;
                  } while (lVar23 != lVar27);
                  local_120 = local_120 + 4;
                } while (uVar22 != uVar20);
                alVar7 = ptr_02[(uint)(iVar29 % iVar28)];
                iVar12 = alVar7[3]._4_4_;
                if (iVar29 / iVar28 < 7) {
                  iVar18 = 1;
                  if (1 < iVar14) {
                    iVar18 = iVar14;
                  }
                  do {
                    auVar35 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,0x28
                                             );
                    alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar35,0xc);
                    iVar12 = alVar7[3]._4_4_;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                auVar35 = vpcmpgtd_avx2(auVar30,auVar4);
                auVar30 = vpcmpgtd_avx2(auVar8,auVar31);
                auVar35 = vpor_avx2(auVar30,auVar35);
                if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar35 >> 0x7f,0) != '\0') ||
                      (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0xbf,0) != '\0') ||
                    (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar35[0x1f] < '\0') {
                  *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                  iVar12 = 0;
                  iVar13 = 0;
                  iVar29 = 0;
                }
                ppVar15->score = iVar12;
                ppVar15->end_query = iVar29;
                ppVar15->end_ref = iVar13;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar15;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}